

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O1

CTcCodeLabel * CTcPrsNode::gen_jump_ahead(uchar opc)

{
  CTcGenTarg *this;
  int iVar1;
  CTcCodeLabel *lbl;
  
  this = G_cg;
  iVar1 = CTcGenTarg::can_skip_op(G_cg);
  if (iVar1 == 0) {
    CTcGenTarg::write_op(this,opc);
    lbl = CTcCodeStream::new_label_fwd(G_cs);
    CTcCodeStream::write_ofs(G_cs,lbl,0,0);
  }
  else {
    lbl = (CTcCodeLabel *)0x0;
  }
  return lbl;
}

Assistant:

CTcCodeLabel *CTcPrsNode::gen_jump_ahead(uchar opc)
{
    /* 
     *   check to see if we should suppress the jump for peephole
     *   optimization 
     */
    if (G_cg->can_skip_op())
        return 0;

    /* emit the opcode */
    G_cg->write_op(opc);

    /* allocate a new label */
    CTcCodeLabel *lbl = G_cs->new_label_fwd();

    /* 
     *   write the forward offset to the label (this will generate a fixup
     *   record attached to the label, so that we'll come back and fix it
     *   up when the real offset is known) 
     */
    G_cs->write_ofs2(lbl, 0);

    /* return the forward label */
    return lbl;
}